

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QByteArray,QPalette>::emplace<QPalette_const&>
          (QHash<QByteArray,QPalette> *this,QByteArray *key,QPalette *args)

{
  QPalettePrivate *pQVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QPalette local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QPalettePrivate **)this;
  if (pQVar1 == (QPalettePrivate *)0x0) {
    local_38.d = (QPalettePrivate *)0x0;
LAB_002c46aa:
    QHash<QByteArray,_QPalette>::detach((QHash<QByteArray,_QPalette> *)this);
    pVar2 = (piter)emplace_helper<QPalette_const&>(this,key,args);
    QHash<QByteArray,_QPalette>::~QHash((QHash<QByteArray,_QPalette> *)&local_38);
  }
  else {
    if (1 < *(uint *)&pQVar1->field_0x0) {
      local_38.d = pQVar1;
      if (*(int *)&pQVar1->field_0x0 != -1) {
        LOCK();
        *(int *)&pQVar1->field_0x0 = *(int *)&pQVar1->field_0x0 + 1;
        UNLOCK();
      }
      goto LAB_002c46aa;
    }
    if (*(ulong *)(pQVar1 + 8) < *(ulong *)(pQVar1 + 0x10) >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar2 = (piter)emplace_helper<QPalette_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_002c471c;
    }
    QPalette::QPalette(&local_38,args);
    pVar2 = (piter)QHash<QByteArray,_QPalette>::emplace_helper<QPalette>
                             ((QHash<QByteArray,_QPalette> *)this,key,&local_38);
    QPalette::~QPalette(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar2;
  }
LAB_002c471c:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }